

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

SN_ELEMENT * __thiscall ON_SerialNumberMap::LastElement(ON_SerialNumberMap *this)

{
  ulong uVar1;
  ON__UINT64 OVar2;
  ulong local_28;
  ON__UINT64 j;
  ON__UINT64 i;
  SN_ELEMENT *e;
  ON_SerialNumberMap *this_local;
  
  i = 0;
  if (this->m_sn_block0->m_purged < this->m_sn_block0->m_count) {
    if (this->m_sn_block0->m_purged != 0) {
      Internal_HashTableInvalidate(this);
      this->m_sn_count = this->m_sn_count - (ulong)this->m_sn_block0->m_purged;
      this->m_sn_purged = this->m_sn_purged - (ulong)this->m_sn_block0->m_purged;
      ON_SN_BLOCK::CullBlockHelper(this->m_sn_block0);
    }
    if (this->m_sn_block0->m_sorted == 0) {
      Internal_HashTableInvalidate(this);
      ON_SN_BLOCK::SortBlockHelper(this->m_sn_block0);
    }
    i = (ON__UINT64)(this->m_sn_block0->m_sn + (this->m_sn_block0->m_count - 1));
  }
  j = this->m_snblk_list_count;
  do {
    OVar2 = j - 1;
    if (j == 0) {
      return (SN_ELEMENT *)i;
    }
    j = OVar2;
  } while (this->m_snblk_list[OVar2]->m_count <= this->m_snblk_list[OVar2]->m_purged);
  if ((i == 0) || (*(ulong *)(i + 0x10) <= this->m_snblk_list[OVar2]->m_sn1)) {
    uVar1 = (ulong)this->m_snblk_list[OVar2]->m_count;
    do {
      local_28 = uVar1;
      if (local_28 == 0) {
        return (SN_ELEMENT *)i;
      }
      uVar1 = local_28 - 1;
    } while (this->m_snblk_list[OVar2]->m_sn[local_28 - 1].m_sn_active == '\0');
    i = (ON__UINT64)(this->m_snblk_list[OVar2]->m_sn + (local_28 - 1));
  }
  return (SN_ELEMENT *)i;
}

Assistant:

struct ON_SerialNumberMap::SN_ELEMENT* ON_SerialNumberMap::LastElement() const
{
  struct SN_ELEMENT* e=0;
  ON__UINT64 i,j;

  // Last element is likely to be m_sn_block0.m_sn[m_sn_block0.m_count-1]
  // so start looking there.
  if ( m_sn_block0.m_count > m_sn_block0.m_purged )
  {
    if ( m_sn_block0.m_purged > 0 )
    {
      // remove purged elements from m_sn_block0

      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_count -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_purged -= m_sn_block0.m_purged;
      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.CullBlockHelper();
    }
    if ( !m_sn_block0.m_sorted )
    {
      // sort m_sn_block0
      // memory location for specific elements will be changed.
      // This will make the hash table invalid.
      const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableInvalidate();

      const_cast<ON_SerialNumberMap*>(this)->m_sn_block0.SortBlockHelper();      
    }
    e = const_cast<struct SN_ELEMENT*>(&m_sn_block0.m_sn[m_sn_block0.m_count-1]);
  }

  i = (ON__UINT64)m_snblk_list_count;
  while(i--)
  {
    if ( m_snblk_list[i]->m_count > m_snblk_list[i]->m_purged )
    {
      if (e && e->m_sn > m_snblk_list[i]->m_sn1 )
        break;
      j = m_snblk_list[i]->m_count;
      while(j--)
      {
        if ( m_snblk_list[i]->m_sn[j].m_sn_active )
        {
          e = &m_snblk_list[i]->m_sn[j];
          break;
        }
      }
      break;
    }
  }

  return e;
}